

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_edge.c
# Opt level: O2

REF_STATUS
ref_edge_rcm_queue_node(REF_INT node,REF_INT degree,REF_INT *queue,REF_INT *nqueue,REF_INT *nhere)

{
  uint uVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  int iVar5;
  
  uVar1 = *nhere;
  uVar2 = 0;
  uVar4 = 0;
  if (0 < (int)uVar1) {
    uVar4 = (ulong)uVar1;
  }
  do {
    if (uVar4 == uVar2) {
LAB_001a1c03:
      iVar5 = *nqueue * 2;
      for (lVar3 = (long)*nqueue; (int)uVar1 < lVar3; lVar3 = lVar3 + -1) {
        queue[iVar5] = queue[iVar5 + -2];
        queue[iVar5 + 1] = queue[iVar5 + -1];
        iVar5 = iVar5 + -2;
      }
      queue[(int)(uVar1 * 2)] = node;
      iVar5 = uVar1 * 2 + 1;
      queue[iVar5] = degree;
      *nqueue = *nqueue + 1;
      *nhere = *nhere + 1;
      return iVar5;
    }
    if (queue[uVar2 * 2 + 1] < degree) {
      uVar1 = (uint)uVar2;
      goto LAB_001a1c03;
    }
    uVar2 = uVar2 + 1;
  } while( true );
}

Assistant:

REF_FCN static REF_STATUS ref_edge_rcm_queue_node(REF_INT node, REF_INT degree,
                                                  REF_INT *queue,
                                                  REF_INT *nqueue,
                                                  REF_INT *nhere) {
  REF_INT location, insert_point;

  /* largest degree first, will dequeue smallest from end of array */

  insert_point = *nhere;
  for (location = 0; location < (*nhere); location++) {
    if (queue[1 + 2 * location] < degree) {
      insert_point = location;
      break;
    }
  }

  for (location = (*nqueue); location > insert_point; location--) {
    queue[0 + 2 * location] = queue[0 + 2 * (location - 1)];
    queue[1 + 2 * location] = queue[1 + 2 * (location - 1)];
  }

  queue[0 + 2 * insert_point] = node;
  queue[1 + 2 * insert_point] = degree;
  (*nqueue)++;

  (*nhere)++;

  /*
  printf("nqueue %d of %d (%d) ins %d\n", *nqueue, node, degree, insert_point);
  for (location = 0; location < (*nqueue); location++) {
    printf("%d: %d (%d)\n", location, queue[0 + 2 * location],
           queue[1 + 2 * location]);
  }
  */

  return REF_SUCCESS;
}